

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# std.cpp
# Opt level: O3

char * lib_find_vsn_suffix(char *name_string,char suffix_char,char *default_vsn,size_t *name_len)

{
  size_t sVar1;
  char *vsn;
  char *pcVar2;
  
  sVar1 = 0xffffffffffffffff;
  do {
    pcVar2 = name_string;
    sVar1 = sVar1 + 1;
    if (*pcVar2 == '\0') break;
    name_string = pcVar2 + 1;
  } while (*pcVar2 != suffix_char);
  *name_len = sVar1;
  if (*pcVar2 == suffix_char) {
    default_vsn = pcVar2 + 1;
  }
  return default_vsn;
}

Assistant:

const char *lib_find_vsn_suffix(const char *name_string, char suffix_char,
                                const char *default_vsn, size_t *name_len)
{
    const char *vsn;
    
    /* find the suffix character, if any */
    for (vsn = name_string ; *vsn != '\0' && *vsn != suffix_char ; ++vsn);

    /* note the length of the name portion */
    *name_len = vsn - name_string;

    /* 
     *   skip the separator if we found one, to point vsn at the start of
     *   the suffix string itself - it we didn't find the separator
     *   character, use the default version string
     */
    if (*vsn == suffix_char)
        ++vsn;
    else
        vsn = default_vsn;

    /* return the version string */
    return vsn;
}